

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  unsigned_long *puVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar2;
  ostream *poVar3;
  result_type seed_00;
  long lVar4;
  uint64_t uVar5;
  undefined1 local_b88 [8];
  RandEngine nextSeed;
  Options options;
  uint64_t local_110;
  optional<unsigned_long> seed;
  Fuzzer fuzzer;
  string WasmFuzzTypesOption;
  long local_68 [2];
  bool *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  bool local_31 [8];
  bool verbose;
  
  fuzzer.rand._40_8_ = &WasmFuzzTypesOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&fuzzer.rand.features,"wasm-fuzz-types options","");
  puVar1 = nextSeed._M_x + 1;
  local_b88 = (undefined1  [8])puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"wasm-fuzz-types","");
  pvVar2 = &fuzzer.types;
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = pvVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,
             "Fuzz type construction, canonicalization, and operations","");
  wasm::Options::Options
            ((Options *)&nextSeed._M_p,(string *)local_b88,
             (string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  if ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
      seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ != pvVar2) {
    operator_delete((void *)seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._8_8_,
                    (ulong)((long)&(fuzzer.types.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->id + 1));
  }
  if (local_b88 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  local_b88 = (undefined1  [8])puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"--seed","");
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = pvVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"");
  WasmFuzzTypesOption.field_2._8_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmFuzzTypesOption.field_2 + 8),
             "Run a single workload generated by the given seed","");
  uStack_50 = 0;
  local_58 = (bool *)&local_110;
  pcStack_40 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:629:15)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:629:15)>
             ::_M_manager;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,
                     (string *)
                     &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,
                     (string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),(int)&fuzzer + 0x60,
                     (function *)0x1,SUB81(&local_58,0));
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if ((long *)WasmFuzzTypesOption.field_2._8_8_ != local_68) {
    operator_delete((void *)WasmFuzzTypesOption.field_2._8_8_,local_68[0] + 1);
  }
  if ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
      seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ != pvVar2) {
    operator_delete((void *)seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._8_8_,
                    (ulong)((long)&(fuzzer.types.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->id + 1));
  }
  if (local_b88 != (undefined1  [8])(nextSeed._M_x + 1)) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  local_31[0] = false;
  local_b88 = (undefined1  [8])(nextSeed._M_x + 1);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"--verbose","");
  seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = pvVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"-v","");
  WasmFuzzTypesOption.field_2._8_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmFuzzTypesOption.field_2 + 8),"Print extra information","");
  uStack_50 = 0;
  local_58 = local_31;
  pcStack_40 = std::
               _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:639:15)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp:639:15)>
             ::_M_manager;
  wasm::Options::add((string *)&nextSeed._M_p,(string *)local_b88,
                     (string *)
                     &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,
                     (string *)(WasmFuzzTypesOption.field_2._M_local_buf + 8),(int)&fuzzer + 0x60,
                     (function *)0x0,SUB81(&local_58,0));
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if ((long *)WasmFuzzTypesOption.field_2._8_8_ != local_68) {
    operator_delete((void *)WasmFuzzTypesOption.field_2._8_8_,local_68[0] + 1);
  }
  if ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
      seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ != pvVar2) {
    operator_delete((void *)seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._8_8_,
                    (ulong)((long)&(fuzzer.types.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->id + 1));
  }
  if (local_b88 != (undefined1  [8])(nextSeed._M_x + 1)) {
    operator_delete((void *)local_b88,nextSeed._M_x[1] + 1);
  }
  wasm::Options::parse((int)&nextSeed + 0x9c0,(char **)(ulong)(uint)argc);
  wasm::Fuzzer::Fuzzer
            ((Fuzzer *)
             &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,local_31[0]);
  if (seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ == '\x01') {
    wasm::Fuzzer::run((Fuzzer *)
                      &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_engaged,local_110);
    if (fuzzer.subtypeIndices.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(fuzzer.subtypeIndices.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)fuzzer.rand.bytes.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)fuzzer.subtypeIndices.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&fuzzer.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (fuzzer._0_8_ != 0) {
      operator_delete((void *)fuzzer._0_8_,
                      (long)fuzzer.types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - fuzzer._0_8_);
    }
    wasm::Options::~Options((Options *)&nextSeed._M_p);
    if ((size_type *)fuzzer.rand._40_8_ != &WasmFuzzTypesOption._M_string_length) {
      operator_delete((void *)fuzzer.rand._40_8_,WasmFuzzTypesOption._M_string_length + 1);
    }
    return 0;
  }
  local_b88 = (undefined1  [8])wasm::getSeed();
  lVar4 = 1;
  uVar5 = (uint64_t)local_b88;
  do {
    uVar5 = (uVar5 >> 0x3e ^ uVar5) * 0x5851f42d4c957f2d + lVar4;
    nextSeed._M_x[lVar4 + -1] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x138);
  nextSeed._M_x[0x137] = 0x138;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration ",10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    seed_00 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                            *)local_b88);
    wasm::Fuzzer::run((Fuzzer *)
                      &seed.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_engaged,seed_00);
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  using namespace wasm;

  const std::string WasmFuzzTypesOption = "wasm-fuzz-types options";

  Options options("wasm-fuzz-types",
                  "Fuzz type construction, canonicalization, and operations");

  std::optional<uint64_t> seed;
  options.add("--seed",
              "",
              "Run a single workload generated by the given seed",
              WasmFuzzTypesOption,
              Options::Arguments::One,
              [&](Options*, const std::string& arg) {
                seed = uint64_t(std::stoull(arg));
              });

  bool verbose = false;
  options.add("--verbose",
              "-v",
              "Print extra information",
              WasmFuzzTypesOption,
              Options::Arguments::Zero,
              [&](Options*, const std::string& arg) { verbose = true; });

  options.parse(argc, argv);

  Fuzzer fuzzer{verbose};
  if (seed) {
    // Run just a single workload with the given seed.
    fuzzer.run(*seed);
  } else {
    // Continuously run workloads with new randomly generated seeds.
    size_t i = 0;
    RandEngine nextSeed(getSeed());
    while (true) {
      std::cout << "Iteration " << ++i << "\n";
      fuzzer.run(nextSeed());
    }
  }
  return 0;
}